

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void sqlite3ExprCodeGetColumnOfTable(Vdbe *v,Table *pTab,int iTabCur,int iCol,int regOut)

{
  int op;
  
  if ((iCol < 0) || (pTab->iPKey == iCol)) {
    sqlite3VdbeAddOp2(v,0x41,iTabCur,regOut);
    if (iCol < 0) {
      return;
    }
  }
  else {
    op = 0x89;
    if ((pTab->tabFlags & 0x10) == 0) {
      op = 0x1d;
    }
    sqlite3VdbeAddOp3(v,op,iTabCur,iCol,regOut);
  }
  sqlite3ColumnDefault(v,pTab,iCol,regOut);
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3ExprCodeGetColumnOfTable(
  Vdbe *v,        /* The VDBE under construction */
  Table *pTab,    /* The table containing the value */
  int iTabCur,    /* The cursor for this table */
  int iCol,       /* Index of the column to extract */
  int regOut      /* Extract the valud into this register */
){
  if( iCol<0 || iCol==pTab->iPKey ){
    sqlite3VdbeAddOp2(v, OP_Rowid, iTabCur, regOut);
  }else{
    int op = IsVirtual(pTab) ? OP_VColumn : OP_Column;
    sqlite3VdbeAddOp3(v, op, iTabCur, iCol, regOut);
  }
  if( iCol>=0 ){
    sqlite3ColumnDefault(v, pTab, iCol, regOut);
  }
}